

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O2

void __thiscall
duckdb::SingleFileStorageCommitState::~SingleFileStorageCommitState
          (SingleFileStorageCommitState *this)

{
  ~SingleFileStorageCommitState(this);
  operator_delete(this);
  return;
}

Assistant:

SingleFileStorageCommitState::~SingleFileStorageCommitState() {
	if (state != WALCommitState::IN_PROGRESS) {
		return;
	}
	try {
		// truncate the WAL in case of a destructor
		RevertCommit();
	} catch (...) { // NOLINT
	}
}